

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcLocalPlacement *in;
  
  in = (IfcLocalPlacement *)operator_new(0x58);
  *(undefined8 *)&in->field_0x48 = 0;
  *(char **)&in->field_0x50 = "IfcLocalPlacement";
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x10 = 0;
  *(undefined ***)in = &PTR__IfcLocalPlacement_0080e108;
  *(undefined ***)&in->field_0x40 = &PTR__IfcLocalPlacement_0080e158;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcLocalPlacement_0080e130;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x18 = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x20 = 0;
  *(undefined8 *)&in->field_0x38 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcLocalPlacement>(db,params,in);
  return (Object *)(&in->field_0x0 + *(long *)(*(long *)in + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }